

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall
llvm::yaml::Scanner::findBlockScalarIndent
          (Scanner *this,uint *BlockIndent,uint BlockExitIndent,uint *LineBreaks,bool *IsDone)

{
  iterator pcVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  iterator pcVar5;
  iterator pcVar6;
  uint uVar7;
  iterator Position;
  uint uVar8;
  iterator pcVar9;
  iterator local_60;
  Twine local_48;
  
  uVar7 = 0;
  do {
    pcVar6 = this->End;
    pcVar5 = this->Current + -1;
    do {
      pcVar1 = pcVar5 + 1;
      Position = pcVar6;
      pcVar9 = pcVar6;
      if (pcVar1 == pcVar6) goto LAB_00188ed0;
      pcVar2 = pcVar5 + 1;
      pcVar5 = pcVar1;
    } while (*pcVar2 == ' ');
    Position = pcVar1 + (*pcVar2 == ' ');
    pcVar9 = pcVar1;
LAB_00188ed0:
    uVar8 = ((int)pcVar9 - (int)this->Current) + this->Column;
    this->Column = uVar8;
    this->Current = Position;
    pcVar5 = skip_nb_char(this,Position);
    if (pcVar5 != Position) {
      if (BlockExitIndent < uVar8) {
        *BlockIndent = uVar8;
        if (uVar7 <= uVar8) {
          return true;
        }
        Twine::Twine(&local_48,"Leading all-spaces line must be smaller than the block indent");
        setError(this,&local_48,local_60);
        return false;
      }
LAB_00188fa8:
      *IsDone = true;
      return true;
    }
    if (pcVar6 == Position) goto LAB_00188fa8;
    if (*Position == '\n') {
      pcVar5 = Position + 1;
    }
    else {
      pcVar5 = Position;
      if (((*Position == '\r') && (pcVar5 = pcVar6, Position + 1 != pcVar6)) &&
         (pcVar5 = Position + 1, Position[1] == '\n')) {
        pcVar5 = Position + 2;
      }
    }
    bVar4 = consumeLineBreakIfPresent(this);
    if (!bVar4) goto LAB_00188fa8;
    pcVar6 = local_60;
    uVar3 = uVar7;
    if (uVar7 < uVar8) {
      pcVar6 = Position;
      uVar3 = uVar8;
    }
    if (pcVar5 != Position) {
      local_60 = pcVar6;
      uVar7 = uVar3;
    }
    *LineBreaks = *LineBreaks + 1;
  } while( true );
}

Assistant:

bool Scanner::findBlockScalarIndent(unsigned &BlockIndent,
                                    unsigned BlockExitIndent,
                                    unsigned &LineBreaks, bool &IsDone) {
  unsigned MaxAllSpaceLineCharacters = 0;
  StringRef::iterator LongestAllSpaceLine;

  while (true) {
    advanceWhile(&Scanner::skip_s_space);
    if (skip_nb_char(Current) != Current) {
      // This line isn't empty, so try and find the indentation.
      if (Column <= BlockExitIndent) { // End of the block literal.
        IsDone = true;
        return true;
      }
      // We found the block's indentation.
      BlockIndent = Column;
      if (MaxAllSpaceLineCharacters > BlockIndent) {
        setError(
            "Leading all-spaces line must be smaller than the block indent",
            LongestAllSpaceLine);
        return false;
      }
      return true;
    }
    if (skip_b_break(Current) != Current &&
        Column > MaxAllSpaceLineCharacters) {
      // Record the longest all-space line in case it's longer than the
      // discovered block indent.
      MaxAllSpaceLineCharacters = Column;
      LongestAllSpaceLine = Current;
    }

    // Check for EOF.
    if (Current == End) {
      IsDone = true;
      return true;
    }

    if (!consumeLineBreakIfPresent()) {
      IsDone = true;
      return true;
    }
    ++LineBreaks;
  }
  return true;
}